

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlParserInputPtr xmlCtxtPopInput(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr ret;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else if (ctxt->inputNr < 1) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    ctxt->inputNr = ctxt->inputNr + -1;
    if (ctxt->inputNr < 1) {
      ctxt->input = (xmlParserInputPtr)0x0;
    }
    else {
      ctxt->input = ctxt->inputTab[ctxt->inputNr + -1];
    }
    ctxt_local = (xmlParserCtxtPtr)ctxt->inputTab[ctxt->inputNr];
    ctxt->inputTab[ctxt->inputNr] = (xmlParserInputPtr)0x0;
  }
  return (xmlParserInputPtr)ctxt_local;
}

Assistant:

xmlParserInputPtr
xmlCtxtPopInput(xmlParserCtxtPtr ctxt)
{
    xmlParserInputPtr ret;

    if (ctxt == NULL)
        return(NULL);
    if (ctxt->inputNr <= 0)
        return (NULL);
    ctxt->inputNr--;
    if (ctxt->inputNr > 0)
        ctxt->input = ctxt->inputTab[ctxt->inputNr - 1];
    else
        ctxt->input = NULL;
    ret = ctxt->inputTab[ctxt->inputNr];
    ctxt->inputTab[ctxt->inputNr] = NULL;
    return (ret);
}